

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt,int options)

{
  int iVar1;
  char **ppcVar2;
  int *piVar3;
  
  if (ctxt != (xmlSaveCtxtPtr)0x0) {
    ppcVar2 = __xmlTreeIndentString();
    xmlSaveSetIndentString(ctxt,*ppcVar2);
    iVar1 = 1;
    if (((options & 1U) != 0) || (iVar1 = 2, (char)options < '\0')) {
      ctxt->format = iVar1;
    }
    if (((uint)options >> 8 & 1) == 0) {
      piVar3 = __xmlSaveNoEmptyTags();
      if (*piVar3 != 0) {
        options = options | 4;
      }
    }
    ctxt->options = options;
  }
  return;
}

Assistant:

static void
xmlSaveCtxtInit(xmlSaveCtxtPtr ctxt, int options)
{
    if (ctxt == NULL) return;

    xmlSaveSetIndentString(ctxt, xmlTreeIndentString);

    if (options & XML_SAVE_FORMAT)
        ctxt->format = 1;
    else if (options & XML_SAVE_WSNONSIG)
        ctxt->format = 2;

    if (((options & XML_SAVE_EMPTY) == 0) &&
        (xmlSaveNoEmptyTags))
	options |= XML_SAVE_NO_EMPTY;

    ctxt->options = options;
}